

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O0

bool __thiscall libcellml::XmlAttribute::inNamespaceUri(XmlAttribute *this,char *ns)

{
  int iVar1;
  undefined8 uVar2;
  string local_38;
  char *local_18;
  char *ns_local;
  XmlAttribute *this_local;
  
  local_18 = ns;
  ns_local = (char *)this;
  namespaceUri_abi_cxx11_(&local_38,this);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = xmlStrcmp(uVar2,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1 == 0;
}

Assistant:

bool XmlAttribute::inNamespaceUri(const char *ns) const
{
    return xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0;
}